

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int __thiscall
CVmObjClass::get_prop
          (CVmObjClass *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_meta_entry_t *argc_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  ushort in_SI;
  vm_obj_id_t *in_RDI;
  undefined4 *in_R8;
  CVmObjClass *in_R9;
  vm_val_t *unaff_retaddr;
  vm_meta_entry_t *entry;
  undefined4 in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  vm_obj_id_t in_stack_fffffffffffffffc;
  
  argc_00 = get_meta_entry(in_R9);
  if ((argc_00 != (vm_meta_entry_t *)0x0) &&
     (iVar1 = (*argc_00->meta_->_vptr_CVmMetaclass[6])(argc_00->meta_,in_RDX,0,in_R9,(ulong)in_SI),
     iVar1 != 0)) {
    *in_R8 = in_ECX;
    return 1;
  }
  iVar1 = get_prop_from_mod((CVmObjClass *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),
                            (vm_prop_id_t)((ulong)in_RDX >> 0x30),
                            (vm_val_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                            (vm_obj_id_t)((ulong)in_R8 >> 0x20),(vm_obj_id_t *)in_R9,(uint *)argc_00
                           );
  if (iVar1 == 0) {
    iVar1 = CVmObject::get_prop((CVmObject *)argc,entry._6_2_,unaff_retaddr,
                                in_stack_fffffffffffffffc,in_RDI,
                                (uint *)CONCAT26(in_SI,in_stack_ffffffffffffffe8));
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjClass::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                          vm_obj_id_t self, vm_obj_id_t *source_obj,
                          uint *argc)
{
    /* 
     *   pass the property request as a static property of the metaclass
     *   with which we're associated 
     */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);
    if (entry != 0 && entry->meta_->call_stat_prop(vmg_ val, 0, argc, prop))
    {
        /* the metaclass object handled it, so we are the definer */
        *source_obj = self;
        return TRUE;
    }

    /* 
     *   Try handling it through the modifier object, if we have one.  Note
     *   that we must search our own intrinsic superclass chain, because our
     *   own true intrinsic class is 'intrinsic class,' but we want to expose
     *   the nominal superclass hierarchy of the intrinsic class itself (for
     *   example, we want to search List->Collection->Object, not
     *   List->IntrinsicClass->Object).  
     */
    if (get_prop_from_mod(vmg_ prop, val, self, source_obj, argc))
        return TRUE;

    /* inherit default handling */
    return CVmObject::get_prop(vmg_ prop, val, self, source_obj, argc);
}